

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

CappedArray<char,_26UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_26UL> *__return_storage_ptr__,Stringifier *this,unsigned_long_long i)

{
  uint8_t *puVar1;
  bool bVar2;
  char *pcVar3;
  unsigned_long_long u;
  uint8_t *puVar4;
  uint8_t reverse [25];
  
  if (i == 0) {
    puVar4 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    puVar4 = reverse;
    do {
      *puVar4 = (char)i + (char)(i / 10) * -10;
      puVar4 = puVar4 + 1;
      bVar2 = 9 < i;
      i = i / 10;
    } while (bVar2);
    pcVar3 = __return_storage_ptr__->content;
    if (puVar4 <= reverse) goto LAB_0022f0ce;
  }
  pcVar3 = __return_storage_ptr__->content;
  do {
    puVar1 = puVar4 + -1;
    puVar4 = puVar4 + -1;
    *pcVar3 = *puVar1 + '0';
    pcVar3 = pcVar3 + 1;
  } while (reverse < puVar4);
LAB_0022f0ce:
  __return_storage_ptr__->currentSize = (long)pcVar3 - (long)__return_storage_ptr__->content;
  return __return_storage_ptr__;
}

Assistant:

static CappedArray<char, sizeof(T) * 3 + 2> stringifyImpl(T i) {
  // We don't use sprintf() because it's not async-signal-safe (for strPreallocated()).
  CappedArray<char, sizeof(T) * 3 + 2> result;
  bool negative = i < 0;
  Unsigned u = negative ? -i : i;
  uint8_t reverse[sizeof(T) * 3 + 1];
  uint8_t* p = reverse;
  if (u == 0) {
    *p++ = 0;
  } else {
    while (u > 0) {
      *p++ = u % 10;
      u /= 10;
    }
  }

  char* p2 = result.begin();
  if (negative) *p2++ = '-';
  while (p > reverse) {
    *p2++ = '0' + *--p;
  }
  result.setSize(p2 - result.begin());
  return result;
}